

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::map_onto<long>
          (Omega_h *this,Read<signed_char> *a_data,LOs *a2b,LO nb,long init_val,Int width)

{
  Alloc *pAVar1;
  ulong uVar2;
  void *extraout_RDX;
  size_t sVar3;
  ulong uVar4;
  Read<signed_char> RVar5;
  Write<signed_char> out;
  Write<int> local_b0;
  Write<int> local_a0;
  Write<int> local_90;
  Write<int> local_80;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_70,"",(allocator *)&local_50);
  Write<long>::Write((Write<long> *)&out,nb * width,init_val,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (((ulong)out.shared_alloc_.alloc & 1) == 0) {
    uVar4 = (out.shared_alloc_.alloc)->size;
  }
  else {
    uVar4 = (ulong)out.shared_alloc_.alloc >> 3;
  }
  pAVar1 = (a_data->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar2 = pAVar1->size;
  }
  else {
    uVar2 = (ulong)pAVar1 >> 3;
  }
  if ((int)(uVar4 >> 3) < (int)(uVar2 >> 3)) {
    if (((ulong)out.shared_alloc_.alloc & 1) == 0) {
      uVar4 = (out.shared_alloc_.alloc)->size;
    }
    else {
      uVar4 = (ulong)out.shared_alloc_.alloc >> 3;
    }
    std::__cxx11::to_string(&local_70,(int)(uVar4 >> 3));
    pAVar1 = (a_data->write_).shared_alloc_.alloc;
    if (((ulong)pAVar1 & 1) == 0) {
      sVar3 = pAVar1->size;
    }
    else {
      sVar3 = (ulong)pAVar1 >> 3;
    }
    std::__cxx11::to_string(&local_50,(int)(sVar3 >> 3));
    printf("ERROR: !( %s %s %s ) : ! ( %s %s %s )\n","out.size()",">=","a_data.size()",
           local_70._M_dataplus._M_p,">=",local_50._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if (((ulong)out.shared_alloc_.alloc & 1) == 0) {
    uVar4 = (out.shared_alloc_.alloc)->size;
  }
  else {
    uVar4 = (ulong)out.shared_alloc_.alloc >> 3;
  }
  pAVar1 = (a_data->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar2 = pAVar1->size;
  }
  else {
    uVar2 = (ulong)pAVar1 >> 3;
  }
  if ((int)(uVar2 >> 3) <= (int)(uVar4 >> 3)) {
    Write<long>::Write(&local_80,(Write<int> *)a_data);
    Write<int>::Write(&local_90,&a2b->write_);
    Write<long>::Write(&local_a0,(Write<int> *)&out);
    map_into<long>((Read<signed_char> *)&local_80,(LOs *)&local_90,(Write<signed_char> *)&local_a0,
                   width);
    Write<long>::~Write((Write<long> *)&local_a0);
    Write<int>::~Write(&local_90);
    Write<long>::~Write((Write<long> *)&local_80);
    Write<long>::Write(&local_b0,(Write<int> *)&out);
    Read<long>::Read((Read<signed_char> *)this,(Write<long> *)&local_b0);
    Write<long>::~Write((Write<long> *)&local_b0);
    Write<long>::~Write((Write<long> *)&out);
    RVar5.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar5.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","(out.size()) >= (a_data.size())",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
       ,0x45);
}

Assistant:

Read<T> map_onto(Read<T> a_data, LOs a2b, LO nb, T init_val, Int width) {
  auto out = Write<T>(nb * width, init_val);
  OMEGA_H_CHECK_OP(out.size(), >=, a_data.size());
  map_into(a_data, a2b, out, width);
  return out;
}